

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  char *stamp_dir;
  cmMakefile *this_00;
  cmDependsFortranInternals *pcVar3;
  char *mod_dir;
  _Base_ptr p_Var4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  string fcName;
  string local_560;
  string fiName;
  string mod_lower;
  string stamp;
  string mod_upper;
  cmGeneratedFileStream fcStream;
  cmGeneratedFileStream fiStream;
  
  LocateModules(this);
  stamp_dir = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  std::__cxx11::string::string
            ((string *)&fiStream,"CMAKE_Fortran_TARGET_MODULE_DIR",(allocator *)&fcStream);
  mod_dir = cmMakefile::GetDefinition(this_00,(string *)&fiStream);
  std::__cxx11::string::~string((string *)&fiStream);
  if (mod_dir == (char *)0x0) {
    mod_dir = cmMakefile::GetCurrentBinaryDirectory
                        (((this->super_cmDepends).LocalGenerator)->Makefile);
  }
  psVar1 = &(this->super_cmDepends).TargetDirectory;
  pcVar3 = this->Internal;
  for (p_Var4 = (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    WriteDependenciesReal
              (this,*(char **)(p_Var4 + 1),(cmDependsFortranSourceInfo *)(p_Var4 + 2),mod_dir,
               stamp_dir,makeDepends,internalDepends);
  }
  std::__cxx11::string::string((string *)&fiName,(string *)psVar1);
  std::__cxx11::string::append((char *)&fiName);
  cmGeneratedFileStream::cmGeneratedFileStream(&fiStream,fiName._M_dataplus._M_p,false);
  std::operator<<((ostream *)&fiStream,"# The fortran modules provided by this target.\n");
  std::operator<<((ostream *)&fiStream,"provides\n");
  pcVar3 = this->Internal;
  p_Var2 = &(pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var2; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar5 = std::operator<<((ostream *)&fiStream," ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 1));
    std::operator<<(poVar5,"\n");
  }
  if ((pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&fcName,(string *)psVar1);
    std::__cxx11::string::append((char *)&fcName);
    cmGeneratedFileStream::cmGeneratedFileStream(&fcStream,fcName._M_dataplus._M_p,false);
    std::operator<<((ostream *)&fcStream,"# Remove fortran modules provided by this target.\n");
    std::operator<<((ostream *)&fcStream,"FILE(REMOVE");
    for (p_Var6 = (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var2;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      std::__cxx11::string::string((string *)&mod_upper,mod_dir,(allocator *)&mod_lower);
      std::__cxx11::string::append((char *)&mod_upper);
      cmsys::SystemTools::UpperCase(&mod_lower,(string *)(p_Var6 + 1));
      std::__cxx11::string::append((string *)&mod_upper);
      std::__cxx11::string::~string((string *)&mod_lower);
      std::__cxx11::string::append((char *)&mod_upper);
      std::__cxx11::string::string((string *)&mod_lower,mod_dir,(allocator *)&stamp);
      std::__cxx11::string::append((char *)&mod_lower);
      std::__cxx11::string::append((string *)&mod_lower);
      std::__cxx11::string::append((char *)&mod_lower);
      std::__cxx11::string::string((string *)&stamp,stamp_dir,(allocator *)&local_560);
      std::__cxx11::string::append((char *)&stamp);
      std::__cxx11::string::append((string *)&stamp);
      std::__cxx11::string::append((char *)&stamp);
      std::operator<<((ostream *)&fcStream,"\n");
      poVar5 = std::operator<<((ostream *)&fcStream,"  \"");
      cmOutputConverter::Convert
                (&local_560,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                 &mod_lower,START_OUTPUT,UNCHANGED);
      poVar5 = std::operator<<(poVar5,(string *)&local_560);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_560);
      poVar5 = std::operator<<((ostream *)&fcStream,"  \"");
      cmOutputConverter::Convert
                (&local_560,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                 &mod_upper,START_OUTPUT,UNCHANGED);
      poVar5 = std::operator<<(poVar5,(string *)&local_560);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_560);
      poVar5 = std::operator<<((ostream *)&fcStream,"  \"");
      cmOutputConverter::Convert
                (&local_560,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                 &stamp,START_OUTPUT,UNCHANGED);
      poVar5 = std::operator<<(poVar5,(string *)&local_560);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&stamp);
      std::__cxx11::string::~string((string *)&mod_lower);
      std::__cxx11::string::~string((string *)&mod_upper);
    }
    std::operator<<((ostream *)&fcStream,"  )\n");
    cmGeneratedFileStream::~cmGeneratedFileStream(&fcStream);
    std::__cxx11::string::~string((string *)&fcName);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fiStream);
  std::__cxx11::string::~string((string *)&fiName);
  return true;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const char* stamp_dir = this->TargetDirectory.c_str();

  // Get the directory in which module files will be created.
  const char* mod_dir;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  if(const char* target_mod_dir =
     mf->GetDefinition("CMAKE_Fortran_TARGET_MODULE_DIR"))
    {
    mod_dir = target_mod_dir;
    }
  else
    {
    mod_dir =
      this->LocalGenerator->GetMakefile()->GetCurrentBinaryDirectory();
    }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for(ObjectInfoMap::const_iterator i = objInfo.begin();
      i != objInfo.end(); ++i)
    {
    if(!this->WriteDependenciesReal(i->first.c_str(), i->second,
                                    mod_dir, stamp_dir,
                                    makeDepends, internalDepends))
      {
      return false;
      }
    }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName.c_str());
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for(std::set<std::string>::const_iterator i = provides.begin();
      i != provides.end(); ++i)
    {
    fiStream << " " << *i << "\n";
    }

  // Create a script to clean the modules.
  if(!provides.empty())
    {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName.c_str());
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    for(std::set<std::string>::const_iterator i = provides.begin();
        i != provides.end(); ++i)
      {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      mod_upper += cmSystemTools::UpperCase(*i);
      mod_upper += ".mod";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      mod_lower += *i;
      mod_lower += ".mod";
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += *i;
      stamp += ".mod.stamp";
      fcStream << "\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(mod_lower,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(mod_upper,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(stamp,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      }
    fcStream << "  )\n";
    }
  return true;
}